

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.h
# Opt level: O2

int __thiscall
lossless_neural_sound::expression_compiler::expression::Element_variable::
structurally_compare_implementation(Element_variable *this,Expression_node *rt)

{
  _func_int **pp_Var1;
  Node *pNVar2;
  Node *pNVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  size_t i;
  long lVar7;
  
  if (rt == (Expression_node *)0x0) {
    __assert_fail("rt",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/programmerjake[P]lossless_neural_sound/src/expression_compiler/expression.h"
                  ,0x31a,
                  "virtual int lossless_neural_sound::expression_compiler::expression::Element_variable::structurally_compare_implementation(const Expression_node *) const"
                 );
  }
  pp_Var1 = (rt->super_Node)._vptr_Node;
  if (pp_Var1 == (_func_int **)&PTR__Node_0012ec30) {
    iVar5 = std::__cxx11::string::compare((string *)&this->matrix_variable->name);
    uVar6 = 0xffffffff;
    if (-1 < iVar5) {
      if (iVar5 == 0) {
        lVar7 = 0;
        do {
          if (lVar7 == 2) {
            return 0;
          }
          pNVar2 = (Node *)(this->indexes)._M_elems[lVar7];
          pNVar3 = (&rt[1].super_Node.hash_next)[lVar7];
          if (pNVar2 < pNVar3) {
            return -1;
          }
          lVar7 = lVar7 + 1;
        } while (pNVar2 <= pNVar3);
      }
      uVar6 = 1;
    }
  }
  else {
    uVar4 = (*pp_Var1[6])(rt);
    uVar6 = 0xffffffff;
    if (uVar4 < 2) {
      uVar6 = (uint)(uVar4 == 0);
    }
  }
  return uVar6;
}

Assistant:

virtual int structurally_compare_implementation(const Expression_node *rt) const
        noexcept override
    {
        assert(rt);
        if(auto *variable = dynamic_cast<const Element_variable *>(rt))
        {
            int name_compare = matrix_variable->name.compare(variable->matrix_variable->name);
            if(name_compare < 0)
                return -1;
            if(name_compare > 0)
                return 1;
            for(std::size_t i = 0; i < indexes.size(); i++)
            {
                if(indexes[i] < variable->indexes[i])
                    return -1;
                if(indexes[i] > variable->indexes[i])
                    return 1;
            }
            return 0;
        }
        auto rt_kind = rt->get_kind();
        if(Kind::Element_variable < rt_kind)
            return -1;
        if(Kind::Element_variable > rt_kind)
            return 1;
        return 0;
    }